

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genDependentAggLoopString
          (CppGenerator *this,TDNode *node,size_t currentLoop,size_t depth,
          dyn_bitset *contributingViews,size_t maxDepth,string *resetString)

{
  value_type vVar1;
  undefined8 uVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  __buckets_ptr pp_Var9;
  const_reference pvVar10;
  pointer ppQVar11;
  reference pvVar12;
  long lVar13;
  reference pvVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  reference this_00;
  ulong uVar16;
  TDNode *in_RCX;
  CppGenerator *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t in_R8;
  size_t in_R9;
  size_t unaff_retaddr;
  string *in_stack_00000008;
  string *in_stack_00000010;
  string prev_3;
  pair<unsigned_long,_unsigned_long> *correspondingLoopAgg_1;
  string post_1;
  string prev_2;
  pair<unsigned_long,_unsigned_long> *correspondingLoopAgg;
  ProductAggregate *prodAgg;
  string aggBody;
  AggregateTuple *aggTuple;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  AggregateTuple *tuple;
  size_t aggID_3;
  size_t off;
  bitset<7UL> increasingIndexes;
  AggregateIndexes aggIdx;
  AggregateIndexes bench;
  size_t offDepth;
  View *view_1;
  size_t *incViewID;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range5;
  size_t v;
  string viewVars;
  View *view;
  size_t outViewID;
  size_t resetOffset;
  string postLoop;
  string local_resdd0;
  string prev_1;
  AggRegTuple *regTuple_2;
  size_t aggID_2;
  size_t startingOffset;
  string post;
  string local_resfa8;
  AggRegTuple *regTuple_1;
  size_t aggID_1;
  string closeLoopString;
  string loopString;
  string resetAggregates;
  size_t viewID;
  DependentLoop *nextDepLoop;
  size_t nextLoop;
  size_t next;
  string local;
  string prev;
  AggRegTuple *regTuple;
  size_t aggID;
  string productString;
  prod_bitset *product;
  size_t prodID;
  string depthString;
  size_t numOfLoops;
  dyn_bitset *thisLoop;
  DependentLoop *depLoop;
  size_t thisLoopID;
  string *returnString;
  string *in_stack_ffffffffffffe068;
  QueryCompiler *in_stack_ffffffffffffe070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe078;
  TreeDecomposition *in_stack_ffffffffffffe080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe0a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  CppGenerator *in_stack_ffffffffffffe0a8;
  undefined7 in_stack_ffffffffffffe0b0;
  byte in_stack_ffffffffffffe0b7;
  AggregateIndexes *in_stack_ffffffffffffe0b8;
  CppGenerator *in_stack_ffffffffffffe0c0;
  undefined6 in_stack_ffffffffffffe0c8;
  undefined1 in_stack_ffffffffffffe0ce;
  byte in_stack_ffffffffffffe0cf;
  long local_1f18;
  string local_1e50 [32];
  string local_1e30 [32];
  string local_1e10 [32];
  pair<unsigned_long,_unsigned_long> *local_1df0;
  string local_1de8 [32];
  string local_1dc8 [32];
  string local_1da8 [32];
  string local_1d88 [24];
  prod_bitset *in_stack_ffffffffffffe290;
  dyn_bitset *in_stack_ffffffffffffe298;
  TDNode *in_stack_ffffffffffffe2a0;
  CppGenerator *in_stack_ffffffffffffe2a8;
  string local_1d48 [32];
  pair<unsigned_long,_unsigned_long> *local_1d28;
  reference local_1d20;
  undefined1 local_1d11 [33];
  string local_1cf0 [32];
  string local_1cd0 [32];
  string local_1cb0 [32];
  string local_1c90 [32];
  string local_1c70 [32];
  string local_1c50 [32];
  string local_1c30 [32];
  reference local_1c10;
  AggregateTuple *local_1c08;
  __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
  local_1c00;
  reference local_1bf8;
  string local_1bf0 [32];
  string local_1bd0 [32];
  reference local_1bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1ba8;
  long local_1ba0;
  undefined1 local_1b90 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b48 [2];
  string local_1b00 [32];
  string local_1ae0 [32];
  string local_1ac0 [32];
  string local_1aa0 [32];
  string local_1a80 [32];
  string local_1a60 [32];
  string local_1a40 [32];
  string local_1a20 [32];
  string local_1a00 [32];
  string local_19e0 [24];
  size_t in_stack_ffffffffffffe638;
  bitset<7UL> *in_stack_ffffffffffffe640;
  size_t in_stack_ffffffffffffe648;
  AggregateIndexes *in_stack_ffffffffffffe650;
  CppGenerator *in_stack_ffffffffffffe658;
  string local_19a0 [32];
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660 [32];
  string local_1640 [32];
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1560;
  string local_1558 [32];
  string local_1538 [32];
  string local_1518 [32];
  reference local_14f8;
  AggregateIndexes *local_14e8;
  reference local_14e0;
  unsigned_long *local_14d8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_14d0;
  long local_14c8;
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  reference local_1460;
  ulong local_1450;
  allocator local_1441;
  string local_1440 [32];
  View *local_1420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1418;
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [32];
  string local_13b0 [32];
  string local_1390 [32];
  string local_1370 [32];
  string local_1350 [32];
  string local_1330 [32];
  long local_1310;
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  reference local_10a8;
  ulong local_10a0;
  ulong local_1098;
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  reference local_f30;
  ulong local_f28;
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  undefined1 local_408 [128];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  reference local_1a8;
  ulong local_1a0;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  reference local_98;
  ulong local_90;
  string local_88 [54];
  allocator local_52;
  byte local_51;
  size_type local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  reference local_40;
  TDNode *node_00;
  
  node_00 = in_RCX;
  local_40 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                       ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8),
                        (size_type)in_RCX);
  local_48 = &local_40->loopFactors;
  local_50 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffe080);
  local_51 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_52);
  std::allocator<char>::~allocator((allocator<char> *)&local_52);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
  local_90 = 0;
  while( true ) {
    uVar16 = local_90;
    pvVar4 = std::
             vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
             ::operator[]((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                           *)(in_RSI + 0x3a0),(size_type)in_RCX);
    sVar5 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size(pvVar4);
    if (sVar5 <= uVar16) break;
    pvVar4 = std::
             vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
             ::operator[]((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                           *)(in_RSI + 0x3a0),(size_type)in_RCX);
    local_98 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                         (pvVar4,local_90);
    genProductString_abi_cxx11_
              (in_stack_ffffffffffffe2a8,in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298,
               in_stack_ffffffffffffe290);
    offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
    std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
    std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
    std::operator+(in_stack_ffffffffffffe078,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe070);
    std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
    std::__cxx11::string::operator+=((string *)in_RDI,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    vVar1 = *(value_type *)(in_RSI + 0x3d0);
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RSI + 0x6b8),(size_type)in_RCX);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,local_90)
    ;
    *pvVar7 = vVar1;
    *(long *)(in_RSI + 0x3d0) = *(long *)(in_RSI + 0x3d0) + 1;
    std::__cxx11::string::~string(local_b8);
    local_90 = local_90 + 1;
  }
  local_1a0 = 0;
  while( true ) {
    uVar16 = local_1a0;
    pvVar8 = std::
             vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                           *)(in_RSI + 0x2f0),(size_type)in_RCX);
    sVar5 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar8);
    if (sVar5 <= uVar16) break;
    pvVar8 = std::
             vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                           *)(in_RSI + 0x2f0),(size_type)in_RCX);
    local_1a8 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[](pvVar8,local_1a0)
    ;
    if ((local_1a8->preLoopAgg & 1U) != 0) {
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=((string *)in_RDI,local_1c8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      uVar16 = (local_1a8->previous).first;
      sVar5 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                        ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8));
      if (uVar16 < sVar5) {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RSI + 0x6a0),(local_1a8->previous).first);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (pvVar6,(local_1a8->previous).second);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_288);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::string::~string(local_2a8);
        std::__cxx11::string::~string(local_268);
      }
      if (((local_1a8->product).first & 1U) != 0) {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RSI + 0x6b8),(size_type)in_RCX);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (pvVar6,(local_1a8->product).second);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_2e8);
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_2c8);
      }
      if ((local_1a8->singleViewAgg & 1U) != 0) {
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_328);
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string((string *)(local_408 + 0x60));
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_388);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::operator+=((string *)in_RDI,";\n");
      vVar1 = *(value_type *)(in_RSI + 0x350);
      pvVar6 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RSI + 0x6a0),(size_type)in_RCX);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar6,local_1a0);
      *pvVar7 = vVar1;
      *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
    }
    local_1a0 = local_1a0 + 1;
  }
  for (local_408._88_8_ = (__buckets_ptr)0x0; uVar2 = local_408._88_8_,
      pp_Var9 = (__buckets_ptr)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_40->next),
      (ulong)uVar2 < pp_Var9; local_408._88_8_ = local_408._88_8_ + 1) {
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_40->next,local_408._88_8_);
    local_408._80_8_ = *pvVar10;
    local_408._72_8_ =
         std::vector<DependentLoop,_std::allocator<DependentLoop>_>::operator[]
                   ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8),
                    local_408._80_8_);
    boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffe0b8,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
    bVar3 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_ffffffffffffe070,
                              (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_ffffffffffffe068);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2ba5be);
    if (!bVar3) break;
    local_408._32_8_ = *(size_t *)(local_408._72_8_ + 0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_408,"",&local_409);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"",&local_431);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"",&local_459);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    uVar2 = local_408._32_8_;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2ba6c3);
    ppQVar11 = (pointer)QueryCompiler::numberOfViews((QueryCompiler *)0x2ba6cb);
    if ((ulong)uVar2 < ppQVar11) {
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=(local_430,local_480);
      std::__cxx11::string::~string(local_480);
      std::__cxx11::string::~string(local_4a0);
      std::__cxx11::string::~string(local_4c0);
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::string::~string(local_500);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_900);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_580);
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::string::~string(local_5e0);
      std::__cxx11::string::~string(local_600);
      std::__cxx11::string::~string(local_620);
      std::__cxx11::string::~string(local_640);
      std::__cxx11::string::~string(local_8e0);
      std::__cxx11::string::~string(local_660);
      std::__cxx11::string::~string(local_680);
      std::__cxx11::string::~string(local_8c0);
      std::__cxx11::string::~string(local_6a0);
      std::__cxx11::string::~string(local_6c0);
      std::__cxx11::string::~string(local_6e0);
      std::__cxx11::string::~string(local_700);
      std::__cxx11::string::~string(local_720);
      std::__cxx11::string::~string(local_740);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::string::~string(local_780);
      std::__cxx11::string::~string(local_8a0);
      std::__cxx11::string::~string(local_7a0);
      std::__cxx11::string::~string(local_7c0);
      std::__cxx11::string::~string(local_7e0);
      std::__cxx11::string::~string(local_800);
      std::__cxx11::string::~string(local_820);
      std::__cxx11::string::~string(local_840);
      std::__cxx11::string::~string(local_860);
      std::__cxx11::string::~string(local_880);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=(local_458,local_920);
      std::__cxx11::string::~string(local_920);
      std::__cxx11::string::~string(local_940);
      std::__cxx11::string::~string(local_960);
      std::__cxx11::string::~string(local_a00);
      std::__cxx11::string::~string(local_980);
      std::__cxx11::string::~string(local_9a0);
      std::__cxx11::string::~string(local_9c0);
      std::__cxx11::string::~string(local_9e0);
    }
    else {
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=(local_430,local_a20);
      std::__cxx11::string::~string(local_a20);
      std::__cxx11::string::~string(local_a40);
      std::__cxx11::string::~string(local_a60);
      std::__cxx11::string::~string(local_a80);
      std::__cxx11::string::~string(local_aa0);
      std::__cxx11::string::~string(local_ac0);
      std::__cxx11::string::~string(local_ae0);
      std::__cxx11::string::~string(local_b00);
      std::__cxx11::string::~string(local_b20);
      std::__cxx11::string::~string(local_dc0);
      std::__cxx11::string::~string(local_b40);
      std::__cxx11::string::~string(local_b60);
      std::__cxx11::string::~string(local_da0);
      std::__cxx11::string::~string(local_b80);
      std::__cxx11::string::~string(local_ba0);
      std::__cxx11::string::~string(local_bc0);
      std::__cxx11::string::~string(local_be0);
      std::__cxx11::string::~string(local_c00);
      std::__cxx11::string::~string(local_c20);
      std::__cxx11::string::~string(local_c40);
      std::__cxx11::string::~string(local_c60);
      std::__cxx11::string::~string(local_d80);
      std::__cxx11::string::~string(local_c80);
      std::__cxx11::string::~string(local_ca0);
      std::__cxx11::string::~string(local_cc0);
      std::__cxx11::string::~string(local_ce0);
      std::__cxx11::string::~string(local_d00);
      std::__cxx11::string::~string(local_d20);
      std::__cxx11::string::~string(local_d40);
      std::__cxx11::string::~string(local_d60);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::__cxx11::string::operator=(local_458,local_de0);
      std::__cxx11::string::~string(local_de0);
      std::__cxx11::string::~string(local_e00);
      std::__cxx11::string::~string(local_e20);
      std::__cxx11::string::~string(local_ec0);
      std::__cxx11::string::~string(local_e40);
      std::__cxx11::string::~string(local_e60);
      std::__cxx11::string::~string(local_e80);
      std::__cxx11::string::~string(local_ea0);
    }
    in_stack_ffffffffffffe070 = (QueryCompiler *)local_408;
    in_stack_ffffffffffffe068 = in_stack_00000008;
    genDependentAggLoopString
              (in_RDX,node_00,in_R8,in_R9,(dyn_bitset *)in_RCX,unaff_retaddr,in_stack_00000008);
    std::__cxx11::string::operator+=(local_430,local_ee0);
    std::__cxx11::string::~string(local_ee0);
    std::operator+(in_stack_ffffffffffffe098,in_stack_ffffffffffffe090);
    std::operator+(in_stack_ffffffffffffe078,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe070);
    std::__cxx11::string::operator+=((string *)in_RDI,local_f00);
    std::__cxx11::string::~string(local_f00);
    std::__cxx11::string::~string(local_f20);
    local_f28 = 0;
    while( true ) {
      uVar16 = local_f28;
      pvVar8 = std::
               vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                             *)(in_RSI + 0x2f0),local_408._80_8_);
      sVar5 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar8);
      if (sVar5 <= uVar16) break;
      pvVar8 = std::
               vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                             *)(in_RSI + 0x2f0),local_408._80_8_);
      local_f30 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                            (pvVar8,local_f28);
      if ((local_f30->postLoopAgg & 1U) != 0) {
        offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_f50);
        std::__cxx11::string::~string(local_f50);
        std::__cxx11::string::~string(local_f70);
        std::__cxx11::string::~string(local_fd0);
        std::__cxx11::string::~string(local_f90);
        std::__cxx11::string::~string(local_fb0);
        uVar16 = (local_f30->previous).first;
        sVar5 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                          ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8)
                          );
        if (uVar16 < sVar5) {
          pvVar12 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),in_R8);
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar12,(local_f30->previous).first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar6,(local_f30->previous).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
          std::operator+((char *)in_stack_ffffffffffffe0b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
          std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1010);
          std::__cxx11::string::~string(local_1010);
          std::__cxx11::string::~string(local_1030);
          std::__cxx11::string::~string(local_ff0);
        }
        uVar16 = (local_f30->postLoop).first;
        sVar5 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                          ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8)
                          );
        if (uVar16 < sVar5) {
          pvVar12 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),in_R8);
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar12,(local_f30->postLoop).first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar6,(local_f30->postLoop).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
          std::operator+((char *)in_stack_ffffffffffffe0b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
          std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1070);
          std::__cxx11::string::~string(local_1070);
          std::__cxx11::string::~string(local_1090);
          std::__cxx11::string::~string(local_1050);
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::operator+=((string *)in_RDI,";\n");
        vVar1 = *(value_type *)(in_RSI + 0x350);
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RSI + 0x6a0),local_408._80_8_);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar6,local_f28);
        *pvVar7 = vVar1;
        *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
      }
      local_f28 = local_f28 + 1;
    }
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string((string *)local_408);
  }
  local_1098 = *(ulong *)(in_RSI + 0x350);
  local_10a0 = 0;
  while( true ) {
    uVar16 = local_10a0;
    pvVar8 = std::
             vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                           *)(in_RSI + 0x2f0),(size_type)in_RCX);
    sVar5 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar8);
    if (sVar5 <= uVar16) break;
    pvVar8 = std::
             vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                           *)(in_RSI + 0x2f0),(size_type)in_RCX);
    local_10a8 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                           (pvVar8,local_10a0);
    if (((local_10a8->postLoopAgg & 1U) == 0) && ((local_10a8->preLoopAgg & 1U) == 0)) {
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=((string *)in_RDI,local_10c8);
      std::__cxx11::string::~string(local_10c8);
      std::__cxx11::string::~string(local_10e8);
      std::__cxx11::string::~string(local_1148);
      std::__cxx11::string::~string(local_1108);
      std::__cxx11::string::~string(local_1128);
      uVar16 = (local_10a8->previous).first;
      sVar5 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                        ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8));
      if (uVar16 < sVar5) {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RSI + 0x6a0),(local_10a8->previous).first);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (pvVar6,(local_10a8->previous).second);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_1188);
        std::__cxx11::string::~string(local_1188);
        std::__cxx11::string::~string(local_11a8);
        std::__cxx11::string::~string(local_1168);
      }
      if (((local_10a8->product).first & 1U) != 0) {
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RSI + 0x6b8),(size_type)in_RCX);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (pvVar6,(local_10a8->product).second);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_11e8);
        std::__cxx11::string::~string(local_11e8);
        std::__cxx11::string::~string(local_1208);
        std::__cxx11::string::~string(local_11c8);
      }
      if ((local_10a8->singleViewAgg & 1U) != 0) {
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_1228);
        std::__cxx11::string::~string(local_1228);
        std::__cxx11::string::~string(local_1248);
        std::__cxx11::string::~string(local_12a8);
        std::__cxx11::string::~string(local_1268);
        std::__cxx11::string::~string(local_1288);
      }
      uVar16 = (local_10a8->postLoop).first;
      sVar5 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                        ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RSI + 0x5c8));
      if (uVar16 < sVar5) {
        pvVar12 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)(in_RSI + 0x338),in_R8);
        pvVar6 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar12,(local_10a8->postLoop).first);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (pvVar6,(local_10a8->postLoop).second);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((char *)in_stack_ffffffffffffe0b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_12e8);
        std::__cxx11::string::~string(local_12e8);
        std::__cxx11::string::~string(local_1308);
        std::__cxx11::string::~string(local_12c8);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::operator+=((string *)in_RDI,";\n");
      vVar1 = *(value_type *)(in_RSI + 0x350);
      pvVar6 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RSI + 0x6a0),(size_type)in_RCX);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar6,local_10a0);
      *pvVar7 = vVar1;
      *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
    }
    local_10a0 = local_10a0 + 1;
  }
  if (local_1098 < *(ulong *)(in_RSI + 0x350)) {
    if (local_50 == 0) {
      local_1f18 = in_R8 + 3;
    }
    else {
      local_1f18 = in_R8 + 2 + local_50;
    }
    local_1310 = local_1f18;
    offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)in_stack_ffffffffffffe0a0);
    std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
    std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
    std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
    std::__cxx11::string::operator+=(in_stack_00000010,local_1330);
    std::__cxx11::string::~string(local_1330);
    std::__cxx11::string::~string(local_1350);
    std::__cxx11::string::~string(local_1410);
    std::__cxx11::string::~string(local_1370);
    std::__cxx11::string::~string(local_1390);
    std::__cxx11::string::~string(local_13f0);
    std::__cxx11::string::~string(local_13b0);
    std::__cxx11::string::~string(local_13d0);
  }
  local_1418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                         ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2bd794)
  ;
  do {
    if (local_1418 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      local_51 = 1;
      std::__cxx11::string::~string(local_88);
      if ((local_51 & 1) == 0) {
        std::__cxx11::string::~string((string *)in_RDI);
      }
      return in_RDI;
    }
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2bd7c8);
    local_1420 = QueryCompiler::getView(in_stack_ffffffffffffe070,(size_t)in_stack_ffffffffffffe068)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1440,"",&local_1441);
    std::allocator<char>::~allocator((allocator<char> *)&local_1441);
    for (local_1450 = 0; local_1450 < 100; local_1450 = local_1450 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffe078,(size_t)in_stack_ffffffffffffe070);
      in_stack_ffffffffffffe0cf =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe070);
      std::bitset<100UL>::reference::~reference(&local_1460);
      if ((in_stack_ffffffffffffe0cf & 1) != 0) {
        in_stack_ffffffffffffe0ce =
             std::bitset<100UL>::operator[]
                       ((bitset<100UL> *)in_stack_ffffffffffffe070,(size_t)in_stack_ffffffffffffe068
                       );
        if ((bool)in_stack_ffffffffffffe0ce) {
          std::operator+(in_stack_ffffffffffffe098,(char *)in_stack_ffffffffffffe090);
          std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2bd8ea);
          in_stack_ffffffffffffe0c0 =
               (CppGenerator *)
               TreeDecomposition::getAttribute
                         (in_stack_ffffffffffffe080,(size_t)in_stack_ffffffffffffe078);
          std::operator+(in_stack_ffffffffffffe078,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe070);
          std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
          std::__cxx11::string::operator+=(local_1440,local_1480);
          std::__cxx11::string::~string(local_1480);
          std::__cxx11::string::~string(local_14a0);
          std::__cxx11::string::~string(local_14c0);
        }
        else {
          local_14c8 = *(long *)(in_RSI + 0xa8) + (long)local_1418 * 0x18;
          local_14d0._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_ffffffffffffe068);
          local_14d8 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_ffffffffffffe068);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_ffffffffffffe070,
                                    (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_ffffffffffffe068), bVar3) {
            local_14e0 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_14d0);
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2bdabe);
            in_stack_ffffffffffffe0b8 =
                 (AggregateIndexes *)
                 QueryCompiler::getView(in_stack_ffffffffffffe070,(size_t)in_stack_ffffffffffffe068)
            ;
            local_14e8 = in_stack_ffffffffffffe0b8;
            std::bitset<100UL>::operator[]
                      ((bitset<100UL> *)in_stack_ffffffffffffe078,(size_t)in_stack_ffffffffffffe070)
            ;
            in_stack_ffffffffffffe0b7 =
                 std::bitset::reference::operator_cast_to_bool
                           ((reference *)in_stack_ffffffffffffe070);
            std::bitset<100UL>::reference::~reference(&local_14f8);
            if ((in_stack_ffffffffffffe0b7 & 1) != 0) {
              std::operator+(in_stack_ffffffffffffe098,(char *)in_stack_ffffffffffffe090);
              std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2bdb7b);
              in_stack_ffffffffffffe0a8 =
                   (CppGenerator *)
                   TreeDecomposition::getAttribute
                             (in_stack_ffffffffffffe080,(size_t)in_stack_ffffffffffffe078);
              std::operator+(in_stack_ffffffffffffe078,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe070);
              std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
              std::__cxx11::string::operator+=(local_1440,local_1518);
              std::__cxx11::string::~string(local_1518);
              std::__cxx11::string::~string(local_1538);
              std::__cxx11::string::~string(local_1558);
              break;
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_14d0);
          }
        }
      }
    }
    std::__cxx11::string::pop_back();
    if ((string *)(in_R8 + 1) < in_stack_00000008) {
      lVar13 = in_R8 + 4;
    }
    else {
      lVar13 = in_R8 + 3;
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar13 + local_50)
    ;
    local_1560 = __rhs;
    if (((byte)(&local_1418->_M_dataplus)[*(long *)(in_RSI + 0xe8)] & 1) == 0) {
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,__rhs);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=((string *)in_RDI,local_19a0);
      std::__cxx11::string::~string(local_19a0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffe640);
      std::__cxx11::string::~string(local_19e0);
      std::__cxx11::string::~string(local_1a00);
      std::__cxx11::string::~string(local_1a20);
      std::__cxx11::string::~string(local_1a40);
      std::__cxx11::string::~string(local_1b00);
      std::__cxx11::string::~string(local_1a60);
      std::__cxx11::string::~string(local_1a80);
      std::__cxx11::string::~string(local_1aa0);
      std::__cxx11::string::~string(local_1ac0);
      std::__cxx11::string::~string(local_1ae0);
    }
    else {
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,__rhs);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,__rhs);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,__rhs);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0a8,__rhs);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe070);
      std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
      std::__cxx11::string::operator+=((string *)in_RDI,local_1580);
      std::__cxx11::string::~string(local_1580);
      std::__cxx11::string::~string(local_15a0);
      std::__cxx11::string::~string(local_15c0);
      std::__cxx11::string::~string(local_15e0);
      std::__cxx11::string::~string(local_1600);
      std::__cxx11::string::~string(local_1620);
      std::__cxx11::string::~string(local_1640);
      std::__cxx11::string::~string(local_1660);
      std::__cxx11::string::~string(local_1980);
      std::__cxx11::string::~string(local_1680);
      std::__cxx11::string::~string(local_16a0);
      std::__cxx11::string::~string(local_1960);
      std::__cxx11::string::~string(local_16c0);
      std::__cxx11::string::~string(local_16e0);
      std::__cxx11::string::~string(local_1700);
      std::__cxx11::string::~string(local_1720);
      std::__cxx11::string::~string(local_1740);
      std::__cxx11::string::~string(local_1760);
      std::__cxx11::string::~string(local_1940);
      std::__cxx11::string::~string(local_1780);
      std::__cxx11::string::~string(local_17a0);
      std::__cxx11::string::~string(local_17c0);
      std::__cxx11::string::~string(local_17e0);
      std::__cxx11::string::~string(local_1800);
      std::__cxx11::string::~string(local_1820);
      std::__cxx11::string::~string(local_1920);
      std::__cxx11::string::~string(local_1840);
      std::__cxx11::string::~string(local_1860);
      std::__cxx11::string::~string(local_1880);
      std::__cxx11::string::~string(local_18a0);
      std::__cxx11::string::~string(local_18c0);
      std::__cxx11::string::~string(local_18e0);
      std::__cxx11::string::~string(local_1900);
    }
    if ((multifaq::cppgen::COMPRESS_AGGREGATES & 1) == 0) {
      local_1bf8 = std::
                   vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                   ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                                 *)(in_RSI + 0x520),(size_type)local_1418);
      local_1c00._M_current =
           (AggregateTuple *)
           std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::begin
                     ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
                      in_stack_ffffffffffffe068);
      local_1c08 = (AggregateTuple *)
                   std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::end
                             ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
                              in_stack_ffffffffffffe068);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                                 *)in_stack_ffffffffffffe070,
                                (__normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                                 *)in_stack_ffffffffffffe068), bVar3) {
        local_1c10 = __gnu_cxx::
                     __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                     ::operator*(&local_1c00);
        offset_abi_cxx11_(in_stack_ffffffffffffe0a8,(size_t)__rhs);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::operator+(in_stack_ffffffffffffe078,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe070);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0a8,__rhs);
        std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
        std::__cxx11::string::operator+=((string *)in_RDI,local_1c30);
        std::__cxx11::string::~string(local_1c30);
        std::__cxx11::string::~string(local_1c50);
        std::__cxx11::string::~string(local_1cf0);
        std::__cxx11::string::~string(local_1c70);
        std::__cxx11::string::~string(local_1c90);
        std::__cxx11::string::~string(local_1cb0);
        std::__cxx11::string::~string(local_1cd0);
        in_stack_ffffffffffffe080 = (TreeDecomposition *)local_1d11;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1d11 + 1),"",(allocator *)in_stack_ffffffffffffe080);
        std::allocator<char>::~allocator((allocator<char> *)local_1d11);
        if ((string *)(local_1c10->local).first < in_stack_00000008) {
          this_00 = std::
                    vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                    ::operator[]((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                                  *)(in_RSI + 0x370),(local_1c10->local).first);
          local_1d20 = std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::operator[]
                                 (this_00,(local_1c10->local).second);
          local_1d28 = &local_1d20->correspondingLoopAgg;
          pvVar12 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),(local_1c10->local).first);
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar12,local_1d28->first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar6,local_1d28->second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
          std::operator+((char *)in_stack_ffffffffffffe0b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
          std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
          std::__cxx11::string::operator+=
                    ((string *)(local_1d11 + 1),(string *)&stack0xffffffffffffe298);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffe298);
          std::__cxx11::string::~string(local_1d88);
          std::__cxx11::string::~string(local_1d48);
        }
        if ((string *)(local_1c10->post).first < in_stack_00000008) {
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)(in_RSI + 0x428),(local_1c10->post).first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar6,(local_1c10->post).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
          std::operator+((char *)in_stack_ffffffffffffe0b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
          std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
          std::__cxx11::string::operator+=((string *)(local_1d11 + 1),local_1dc8);
          std::__cxx11::string::~string(local_1dc8);
          std::__cxx11::string::~string(local_1de8);
          std::__cxx11::string::~string(local_1da8);
        }
        if ((local_1c10->hasDependentComputation & 1U) != 0) {
          local_1df0 = &(local_1c10->dependentProdAgg).correspondingLoopAgg;
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)(in_RSI + 0x6a0),local_1df0->first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar6,local_1df0->second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe0a8);
          std::operator+((char *)in_stack_ffffffffffffe0b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
          std::operator+(in_stack_ffffffffffffe078,(char *)in_stack_ffffffffffffe070);
          std::__cxx11::string::operator+=((string *)(local_1d11 + 1),local_1e30);
          std::__cxx11::string::~string(local_1e30);
          std::__cxx11::string::~string(local_1e50);
          std::__cxx11::string::~string(local_1e10);
        }
        uVar16 = std::__cxx11::string::empty();
        if ((uVar16 & 1) != 0) {
          std::__cxx11::string::operator=((string *)(local_1d11 + 1),"1*");
        }
        std::__cxx11::string::operator+=((string *)in_RDI,(string *)(local_1d11 + 1));
        std::__cxx11::string::pop_back();
        std::__cxx11::string::operator+=((string *)in_RDI,";\n");
        std::__cxx11::string::~string((string *)(local_1d11 + 1));
        __gnu_cxx::
        __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
        ::operator++(&local_1c00);
      }
    }
    else {
      in_stack_ffffffffffffe098 = local_1b48;
      AggregateIndexes::AggregateIndexes((AggregateIndexes *)0x2becce);
      AggregateIndexes::AggregateIndexes((AggregateIndexes *)0x2becdb);
      std::bitset<7UL>::bitset((bitset<7UL> *)0x2bece8);
      pvVar14 = std::
                vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                              *)(in_RSI + 0x520),(size_type)local_1418);
      std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::operator[](pvVar14,0);
      mapAggregateToIndexes
                (in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
                 (AggregateTuple *)CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),
                 (size_t *)in_stack_ffffffffffffe0a8,(size_t *)__rhs);
      local_1ba0 = 0;
      local_1ba8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      while( true ) {
        in_stack_ffffffffffffe090 = local_1ba8;
        pvVar14 = std::
                  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                                *)(in_RSI + 0x520),(size_type)local_1418);
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::size(pvVar14);
        if (pbVar15 <= in_stack_ffffffffffffe090) break;
        pvVar14 = std::
                  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                                *)(in_RSI + 0x520),(size_type)local_1418);
        local_1bb0 = std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::operator[]
                               (pvVar14,(size_type)local_1ba8);
        AggregateIndexes::reset((AggregateIndexes *)in_stack_ffffffffffffe070);
        mapAggregateToIndexes
                  (in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8,
                   (AggregateTuple *)CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),
                   (size_t *)in_stack_ffffffffffffe0a8,(size_t *)__rhs);
        bVar3 = AggregateIndexes::isIncrement
                          ((AggregateIndexes *)
                           CONCAT17(in_stack_ffffffffffffe0cf,
                                    CONCAT16(in_stack_ffffffffffffe0ce,in_stack_ffffffffffffe0c8)),
                           (AggregateIndexes *)in_stack_ffffffffffffe0c0,
                           (size_t *)in_stack_ffffffffffffe0b8,
                           (bitset<7UL> *)
                           CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0));
        if (bVar3) {
          local_1ba0 = local_1ba0 + 1;
        }
        else {
          outputFinalRegTupleString_abi_cxx11_
                    (in_stack_ffffffffffffe658,in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,
                     in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1bd0);
          std::__cxx11::string::~string(local_1bd0);
          memcpy(local_1b48,local_1b90,0x48);
          local_1ba0 = 0;
          std::bitset<7UL>::reset((bitset<7UL> *)in_stack_ffffffffffffe070);
        }
        local_1ba8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1ba8->field_0x1;
      }
      outputFinalRegTupleString_abi_cxx11_
                (in_stack_ffffffffffffe658,in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,
                 in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
      std::__cxx11::string::operator+=((string *)in_RDI,local_1bf0);
      std::__cxx11::string::~string(local_1bf0);
    }
    in_stack_ffffffffffffe078 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                   ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffe0a8,(size_type)__rhs);
    local_1418 = in_stack_ffffffffffffe078;
    std::__cxx11::string::~string(local_1440);
  } while( true );
}

Assistant:

std::string CppGenerator::genDependentAggLoopString(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews, const size_t maxDepth,std::string& resetString)
{
    const size_t thisLoopID = currentLoop;

    const DependentLoop& depLoop = depListOfLoops[thisLoopID];
    const dyn_bitset& thisLoop = depLoop.loopFactors;

    size_t numOfLoops = thisLoop.count();

    std::string returnString = "";

    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];

        // We turn the product into a string 
        std::string productString = genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString+";\n";
        
        // increment the counter and update the remapping array
        depLocalProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    // for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size();
    // ++viewProd)
    // {
    //     std::string viewProduct = "";
    //     for (const std::pair<size_t, size_t>& viewAgg :
    //              viewProductList[thisLoopID][viewProd])
    //     {
    //         viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
    //             std::to_string(viewAgg.second)+"]*";
    //     }   
    //     viewProduct.pop_back();
    //     returnString += offset(3+depth+numOfLoops)+
    //         "viewRegister["+std::to_string(viewCounter)+"] = "+
    //         viewProduct +";\n";
    //     // Increment the counter and update the remapping array
    //     viewProductRemapping[thisLoopID][viewProd] = viewCounter;
    //     ++viewCounter;
    // }    
    
    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {        
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }

            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
            
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";

            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;

        }
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < depLoop.next.size(); ++next)
    {
        size_t nextLoop = depLoop.next[next];
        DependentLoop& nextDepLoop = depListOfLoops[nextLoop];
        
        if (((nextDepLoop.loopFactors & thisLoop) == thisLoop))
        {
            size_t viewID = nextDepLoop.loopVariable;

            std::string resetAggregates = "";
            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            // std::cout<< "Call genDependentAggLoopString from 1 \n";
            loopString += genDependentAggLoopString(
                node, nextLoop, depth, contributingViews, maxDepth, resetAggregates);
            
            returnString += resetAggregates+loopString+closeLoopString;

            // After recurse, add the aggregates that have been added with post FLAG
            for (size_t aggID = 0; aggID <
                     newAggregateRegister[nextLoop].size(); ++aggID)
            {
                const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                if (regTuple.postLoopAgg)
                {

                    // TODO: TODO:  Make sure this is correct -- Can we use
                    // equality here?

                    // We use a mapping to the correct index
                    returnString += offset(3+depth+numOfLoops)+
                        "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";
                    
                    if (regTuple.previous.first < depListOfLoops.size())
                    {
                        std::string local = std::to_string(
                            newAggregateRemapping[depth]
                            [regTuple.previous.first]
                            [regTuple.previous.second]);
                        returnString += "aggregateRegister["+local+"]*";
                    }

                    if (regTuple.postLoop.first < depListOfLoops.size())
                    {
                        std::string post = std::to_string(
                            newAggregateRemapping[depth][regTuple.postLoop.first]
                            [regTuple.postLoop.second]); 
                        returnString += "aggregateRegister["+post+"]*";
                    }
                    
                    returnString.pop_back();
                    returnString += ";\n";
            
                    // Increment the counter and update the remapping array
                    depAggregateRemapping[nextLoop][aggID] = aggregateCounter;
                    ++aggregateCounter;
                }
            }
        }
        else break;
    }


    size_t startingOffset = aggregateCounter;

    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (!regTuple.postLoopAgg && !regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }
            
            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
        
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            if (regTuple.postLoop.first < depListOfLoops.size())
            {
                std::string postLoop = std::to_string(
                    newAggregateRemapping[depth][regTuple.postLoop.first]
                    [regTuple.postLoop.second]);
                returnString += "aggregateRegister["+postLoop+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";
            
            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;
        }
    }

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    size_t outViewID = depLoop.outView.find_first();
    while (outViewID != boost::dynamic_bitset<>::npos)
    {
        View* view = _qc->getView(outViewID);
        
        // Add the code that outputs tuples for the views           
        std::string viewVars = "";            
        for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
        {
            if (view->_fVars[v])
            {
                if (node._bag[v])
                {
                    viewVars += node._name+"Tuple."+
                        _td->getAttribute(v)->_name+",";
                }
                else
                {
                    for (const size_t& incViewID : incomingViews[outViewID])
                    {
                        View* view = _qc->getView(incViewID);
                        if (view->_fVars[v])
                        {
                            viewVars += viewName[incViewID]+"Tuple."+
                                _td->getAttribute(v)->_name+",";
                            break;
                        }
                    }
                }
            }
        }
        viewVars.pop_back();

        // size_t offDepth = numOfLoops+depth+3;
        size_t offDepth = (depth + 1 < maxDepth ?
                           4+depth+numOfLoops : 3+depth+numOfLoops);
        
        if (_requireHashing[outViewID])
        {

            returnString +=
                offset(offDepth)+viewName[outViewID]+"_iterator = "+
                viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                offset(offDepth)+"if ("+viewName[outViewID]+"_iterator != "+
                viewName[outViewID]+"_map.end())\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_iterator->second.aggregates[0];\n"+
                offset(offDepth)+"else\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_map.insert({{"+viewVars+
                "},{}}).first->second.aggregates[0];\n";

            // This code is an alternative way to update the views that require hashing
            // returnString +=
            //     offset(offDepth)+viewName[outViewID]+"_pair = "+
            //     viewName[outViewID]+"_map.insert({{"+viewVars+"},"+
            //     viewName[outViewID]+".size()});\n"+
            //     offset(offDepth)+"if ("+viewName[outViewID]+"_pair.second)\n"+
            //     offset(offDepth)+"{\n"+
            //     offset(offDepth+1)+viewName[outViewID]+
            //     ".emplace_back("+viewVars+");\n"+
            //     offset(offDepth)+"}\n"+
            //     offset(offDepth)+"aggregates_"+viewName[outViewID]+
            //     " = "+viewName[outViewID]+"["+viewName[outViewID]+
            //     "_pair.first->second].aggregates;\n";

                // "//-----------------------------\n"+
                // offset(offDepth)+viewName[outViewID]+"_iterator"+
                // " = "+viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                // offset(offDepth)+"if ("+viewName[outViewID]+"_iterator"
                // " != "+viewName[outViewID]+"_map.end())\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"["+viewName[outViewID]+
                // "_iterator->second].aggregates;\n"+
                // offset(offDepth)+"}\n"+
                // offset(offDepth)+"else\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"size_t idx_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+".size();\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // // "_map.emplace("+viewVars+",idx_"+viewName[outViewID]+");\n"+
                // "_map[{"+viewVars+"}] = idx_"+viewName[outViewID]+";\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // ".emplace_back("+viewVars+");\n"+
                // // ".push_back({"+viewVars+"});\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"[idx_"+viewName[outViewID]+
                // "].aggregates;\n"+
                // offset(offDepth)+"}\n";
        }
        else
        {
            // just add string to push to view
            returnString += offset(offDepth)+viewName[outViewID]+
                ".emplace_back("+viewVars+");\n"+offset(offDepth)+
                // ".push_back({"+viewVars+"});\n"+offset(offDepth)+
                "aggregates_"+viewName[outViewID]+" = "+viewName[outViewID]+
                ".back().aggregates;\n";
        }

        if (COMPRESS_AGGREGATES)
        {
            AggregateIndexes bench, aggIdx;
            std::bitset<7> increasingIndexes;
        
            mapAggregateToIndexes(bench,aggregateComputation[outViewID][0],
                                  outViewID,maxDepth);
        
            size_t off = 0;
            for (size_t aggID = 1; aggID <
                     aggregateComputation[outViewID].size(); ++aggID)
            {
                const AggregateTuple& tuple = aggregateComputation[outViewID][aggID];

                aggIdx.reset();
                mapAggregateToIndexes(aggIdx,tuple,outViewID,maxDepth);

                // if (outViewID == 0)
                //     std::cout << aggID << " : " << increasingIndexes << std::endl;

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputFinalRegTupleString(
                        bench,off,increasingIndexes,offDepth);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                    increasingIndexes.reset();
                }
            }

            // If not, output bench and all offset
            // aggregateString
            returnString += outputFinalRegTupleString(
                bench,off,increasingIndexes,offDepth);
        }
        else 
        {
            for(const AggregateTuple& aggTuple : aggregateComputation[outViewID])
            {
                returnString += offset(offDepth)+"aggregates_"+
                    viewName[outViewID]+"["+std::to_string(aggTuple.aggID)+
                    "] += ";

                std::string aggBody = "";
                if (aggTuple.local.first < maxDepth)
                {
                    const ProductAggregate& prodAgg =
                        productToVariableRegister[aggTuple.local.first]
                        [aggTuple.local.second];
        
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        prodAgg.correspondingLoopAgg;
                    
                    std::string prev = std::to_string(
                        newAggregateRemapping[aggTuple.local.first]
                        [correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);
                
                    aggBody += "aggregateRegister["+prev+"]*";
                }
                if (aggTuple.post.first < maxDepth)
                {
                    std::string post = std::to_string(
                        postRemapping[aggTuple.post.first]
                        [aggTuple.post.second]);
                    aggBody += "postRegister["+post+"]*";
                }

                if (aggTuple.hasDependentComputation)
                {
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        aggTuple.dependentProdAgg.correspondingLoopAgg;
                
                    std::string prev = std::to_string(
                        depAggregateRemapping[correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);

                    aggBody += "aggregateRegister["+prev+"]*";
                }
                // TODO:TODO:TODO: ---> make sure this is correct
                if (aggBody.empty())
                    aggBody = "1*";
                returnString += aggBody;
                returnString.pop_back();
                returnString += ";\n";            
            }
        }

        outViewID = depLoop.outView.find_next(outViewID);
    }

    return returnString;
}